

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O3

void oonf_timer_remove(oonf_timer_class *info)

{
  oonf_timer_instance *poVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  oonf_timer_instance *timer;
  
  plVar3 = (info->_node).next;
  if ((plVar3 != (list_entity *)0x0) && (plVar4 = (info->_node).prev, plVar4 != (list_entity *)0x0))
  {
    plVar2 = _timer_tree.list_head.prev;
    timer = (oonf_timer_instance *)_timer_tree.list_head.next;
    if ((_timer_tree.list_head.next)->prev != _timer_tree.list_head.prev) {
      do {
        poVar1 = (oonf_timer_instance *)(timer->_node).list.next;
        if (timer->class == info) {
          oonf_timer_stop(timer);
          plVar2 = _timer_tree.list_head.prev;
        }
        timer = poVar1;
      } while ((poVar1->_node).list.prev != plVar2);
      plVar3 = (info->_node).next;
      plVar4 = (info->_node).prev;
    }
    plVar4->next = plVar3;
    plVar3->prev = plVar4;
    (info->_node).next = (list_entity *)0x0;
    (info->_node).prev = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
oonf_timer_remove(struct oonf_timer_class *info) {
  struct oonf_timer_instance *timer, *iterator;

  if (!list_is_node_added(&info->_node)) {
    /* only free node if its hooked to the timer core */
    return;
  }

  avl_for_each_element_safe(&_timer_tree, timer, _node, iterator) {
    if (timer->class == info) {
      oonf_timer_stop(timer);
    }
  }

  list_remove(&info->_node);
}